

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

void Vec_StrPutF_(Vec_Str_t *vOut,float Val)

{
  Vec_StrPush(vOut,SUB41(Val,0));
  Vec_StrPush(vOut,(char)((uint)Val >> 8));
  Vec_StrPush(vOut,(char)((uint)Val >> 0x10));
  Vec_StrPush(vOut,(char)((uint)Val >> 0x18));
  return;
}

Assistant:

static inline void Vec_StrPutF_( Vec_Str_t * vOut, float Val )   { Vec_StrPutF( vOut, Val );  }